

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O1

void WjTestLib_NewGroup(char *GroupName)

{
  WJTL_STATUS WVar1;
  WjtlGroupList *pWVar2;
  char *pcVar3;
  WjtlTestList *pWVar4;
  WjtlGroupList **ppWVar5;
  WjtlTestList *pWVar6;
  WjtlGroupList *unaff_RBX;
  char *pcVar7;
  long lVar8;
  WjtlGroupList *pWVar9;
  WjtlGroupList *unaff_R12;
  bool bVar10;
  uint64_t uStack_b8;
  uint64_t uStack_b0;
  uint64_t uStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  uint64_t uStack_90;
  WjtlGroupList *pWStack_88;
  uint64_t auStack_80 [2];
  WjtlGroupList *pWStack_70;
  WjtlGroupList *pWStack_68;
  
  pWVar9 = (WjtlGroupList *)0x1;
  pcVar7 = (char *)0x28;
  pWVar2 = (WjtlGroupList *)calloc(1,0x28);
  if (pWVar2 == (WjtlGroupList *)0x0) {
    WjTestLib_NewGroup_cold_2();
  }
  else {
    pcVar3 = strdup(GroupName);
    pWVar2->GroupName = pcVar3;
    unaff_RBX = pWVar2;
    pWVar9 = (WjtlGroupList *)GroupName;
    if (pcVar3 != (char *)0x0) {
      pWVar2->Next = (WjtlGroupList *)0x0;
      pWVar2->TestListHead = (WjtlTestList *)0x0;
      pWVar2->TestListTail = (WjtlTestList *)0x0;
      ppWVar5 = &gGroupListHead;
      if (gGroupListTail != (WjtlGroupList *)0x0) {
        ppWVar5 = &gGroupListTail->Next;
      }
      ((WjtlGroupList *)ppWVar5)->Next = pWVar2;
      gGroupListTail = pWVar2;
      return;
    }
  }
  WjTestLib_NewGroup_cold_1();
  if ((pWVar9 == (WjtlGroupList *)0x0) || (pcVar7 == (char *)0x0)) {
    WjTestLib_AddTest_cold_1();
LAB_0011e0ce:
    WjTestLib_AddTest_cold_4();
  }
  else {
    if (gGroupListTail == (WjtlGroupList *)0x0) {
      WjTestLib_NewGroup("Default");
    }
    unaff_R12 = gGroupListTail;
    unaff_RBX = pWVar9;
    if (gGroupListTail == (WjtlGroupList *)0x0) goto LAB_0011e0ce;
    pWVar4 = (WjtlTestList *)calloc(1,0x50);
    if (pWVar4 != (WjtlTestList *)0x0) {
      pcVar7 = strdup(pcVar7);
      pWVar4->TestName = pcVar7;
      if (pcVar7 != (char *)0x0) {
        pWVar4->NumAsserts = 0;
        pWVar4->NumFailedAsserts = 0;
        pWVar4->NumAllocations = 0;
        pWVar4->NumDeallocations = 0;
        pWVar4->TestFunction = (WJTL_UNIT_TEST_FUNCTION)pWVar9;
        pWVar4->Next = (WjtlTestList *)0x0;
        pWVar6 = (WjtlTestList *)&unaff_R12->TestListHead;
        if (unaff_R12->TestListTail != (WjtlTestList *)0x0) {
          pWVar6 = unaff_R12->TestListTail;
        }
        pWVar6->Next = pWVar4;
        unaff_R12->TestListTail = pWVar4;
        return;
      }
      goto LAB_0011e0d8;
    }
  }
  WjTestLib_AddTest_cold_3();
LAB_0011e0d8:
  WjTestLib_AddTest_cold_2();
  pWVar9 = gGroupListHead;
  pWStack_70 = unaff_RBX;
  pWStack_68 = unaff_R12;
  if (gGroupListHead != (WjtlGroupList *)0x0) {
    pWStack_88 = gGroupListHead;
    bVar10 = false;
    do {
      printf(":::::::: Test Group : %s ::::::::\n",pWVar9->GroupName);
      for (pWVar4 = pWVar9->TestListHead; pWVar4 != (WjtlTestList *)0x0; pWVar4 = pWVar4->Next) {
        printf(":::: Test : %s ::::\n",pWVar4->TestName);
        uStack_90 = 0;
        auStack_80[1] = 0;
        uStack_98 = 0;
        uStack_a0 = 0;
        auStack_80[0] = 0;
        uStack_a8 = 0;
        uStack_b0 = 0;
        uStack_b8 = 0;
        WjTestLib_Memory_GetStats(&uStack_90,auStack_80 + 1,&uStack_98);
        WjTestLib_Asserts_Reset();
        WVar1 = (*pWVar4->TestFunction)();
        WjTestLib_Memory_GetStats(&uStack_a0,auStack_80,&uStack_a8);
        WjTestLib_Asserts_GetStats(&uStack_b0,&uStack_b8);
        pWVar4->TestStatus = WVar1;
        pWVar4->NumAsserts = uStack_b0;
        pWVar4->NumFailedAsserts = uStack_b8;
        if (uStack_b8 != 0) {
          printf("#### %lu Assert fails in test: %s\n",uStack_b8,pWVar4->TestName);
        }
        pWVar4->NumAllocations = uStack_a0 - uStack_90;
        lVar8 = uStack_a8 - uStack_98;
        pWVar4->NumMemLeaks = lVar8;
        if (lVar8 != 0) {
          printf("#### %lu Memory leaks in test: %s\n",lVar8,pWVar4->TestName);
        }
        bVar10 = true;
        pWVar9->GroupRun = true;
        pWVar4->TestRun = true;
      }
      pWVar9 = pWVar9->Next;
    } while (pWVar9 != (WjtlGroupList *)0x0);
    pWVar9 = pWStack_88;
    if (bVar10) {
      return;
    }
  }
  pcVar7 = "No test named: %s\n";
  if (pWVar9 == (WjtlGroupList *)0x0) {
    pcVar7 = "No group named: %s\n";
  }
  printf(pcVar7,0);
  return;
}

Assistant:

void
WjTestLib_NewGroup
    (
        char const*     GroupName
    )
{
    WjtlGroupList* newGroup = calloc( 1, sizeof(WjtlGroupList) );
    if( NULL != newGroup )
    {
        newGroup->GroupName = strdup( GroupName );
        if( NULL != newGroup->GroupName )
        {
            newGroup->Next = NULL;
            newGroup->TestListHead = NULL;
            newGroup->TestListTail = NULL;

            if( NULL != gGroupListTail )
            {
                gGroupListTail->Next = newGroup;
            }
            else
            {
                gGroupListHead = newGroup;
            }
            gGroupListTail = newGroup;
        }
        else
        {
            InternalError( "Memory Fail" );
        }
    }
    else
    {
        InternalError( "Memory Fail" );
    }
}